

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floattype.cpp
# Opt level: O2

ResultValue * __thiscall
FloatType::toResultValue
          (ResultValue *__return_storage_ptr__,FloatType *this,NumericConstant *numericConstant)

{
  NumericConstantChar numChar;
  NumericChars *pNVar1;
  size_t i;
  ulong uVar2;
  double value_00;
  string value;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  for (uVar2 = 0; pNVar1 = NumericConstant::chars(numericConstant),
      uVar2 < (ulong)((long)(pNVar1->
                            super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pNVar1->
                           super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                           )._M_impl.super__Vector_impl_data._M_start); uVar2 = uVar2 + 1) {
    pNVar1 = NumericConstant::chars(numericConstant);
    numChar = (pNVar1->super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar2];
    if (numChar < 0x14) {
      if ((0x403ffU >> (numChar & 0x1f) & 1) == 0) {
        if ((0x30000U >> (numChar & 0x1f) & 1) == 0) {
          if (numChar != 0x13) goto LAB_0013a55c;
          break;
        }
        if (uVar2 != 0) break;
      }
      NumericConstantChars::getChar(numChar);
      std::__cxx11::string::push_back((char)&local_50);
    }
LAB_0013a55c:
  }
  value_00 = std::__cxx11::stod(&local_50,(size_t *)0x0);
  ResultValue::ResultValue(__return_storage_ptr__,value_00);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

ResultValue FloatType::toResultValue(const NumericConstant& numericConstant) const {
	std::string value = "";

	for (std::size_t i = 0; i < numericConstant.chars().size(); i++) {
		auto c = numericConstant.chars()[i];
		bool exit = false;

		switch (c) {
			case NumericConstantChar::Zero:
			case NumericConstantChar::One:
			case NumericConstantChar::Two:
			case NumericConstantChar::Three:
			case NumericConstantChar::Four:
			case NumericConstantChar::Five:
			case NumericConstantChar::Six:
			case NumericConstantChar::Seven:
			case NumericConstantChar::Eight:
			case NumericConstantChar::Nine:
			case NumericConstantChar::DecimalPoint:
				value += NumericConstantChars::getChar(c);
				break;
			case NumericConstantChar::MinusSign:
			case NumericConstantChar::PlusSign:
				if (i > 0) {
					exit = true;
				} else {
					value += NumericConstantChars::getChar(c);
				}
				break;
			case NumericConstantChar::ImaginaryUnit:
				exit = true;
				break;
			default:
				break;
		}

		if (exit) {
			break;
		}
	}

	return std::stod(value);
}